

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

bool __thiscall
kwssys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Glob *pGVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  ulong uVar5;
  RegularExpression *in_RCX;
  size_type in_RDX;
  Glob *in_RSI;
  long in_RDI;
  const_iterator pathIt;
  string message;
  string canonicalPath;
  string realPathErrorMessage;
  bool isSymLink;
  bool isDir;
  string fname;
  string realname;
  unsigned_long cc;
  string errorMessage;
  Directory d;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  RegularExpression *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc14;
  undefined1 in_stack_fffffffffffffc15;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  char *in_stack_fffffffffffffc18;
  Glob *this_00;
  string *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  Directory *in_stack_fffffffffffffc68;
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  string local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [72];
  string local_208 [32];
  string local_1e8 [38];
  undefined1 local_1c2;
  byte local_1c1;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  Glob *local_120;
  int local_114;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [88];
  Status local_58;
  string local_50 [32];
  GlobMessages *in_stack_ffffffffffffffd0;
  byte local_1;
  
  Directory::Directory((Directory *)in_stack_fffffffffffffbd0);
  std::__cxx11::string::string(local_50);
  local_58 = Directory::Load(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                             in_stack_fffffffffffffc58);
  bVar1 = Status::operator_cast_to_bool((Status *)0x1c2132);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_140);
    std::__cxx11::string::string(local_160);
    local_120 = (Glob *)0x0;
    while (this_00 = local_120, pGVar4 = (Glob *)Directory::GetNumberOfFiles((Directory *)0x1c238f),
          this_00 < pGVar4) {
      files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)Directory::GetFile((Directory *)in_stack_fffffffffffffbd0,
                                    CONCAT17(in_stack_fffffffffffffbcf,
                                             CONCAT16(in_stack_fffffffffffffbce,
                                                      CONCAT24(in_stack_fffffffffffffbcc,
                                                               in_stack_fffffffffffffbc8))));
      std::__cxx11::string::operator=(local_160,(char *)files);
      uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbd0,
                              (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                               CONCAT16(in_stack_fffffffffffffbce,
                                                        CONCAT24(in_stack_fffffffffffffbcc,
                                                                 in_stack_fffffffffffffbc8))));
      if ((!(bool)uVar2) &&
         (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffbd0,
                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                   CONCAT16(in_stack_fffffffffffffbce,
                                                            CONCAT24(in_stack_fffffffffffffbcc,
                                                                     in_stack_fffffffffffffbc8)))),
         !(bool)uVar3)) {
        if (in_RSI == (Glob *)0x0) {
          std::operator+(in_stack_fffffffffffffbf8._M_current,in_stack_fffffffffffffbf0);
          std::__cxx11::string::operator=(local_140,local_180);
          std::__cxx11::string::~string(local_180);
        }
        else {
          std::operator+(in_stack_fffffffffffffbf8._M_current,(char *)in_stack_fffffffffffffbf0);
          std::operator+(in_stack_fffffffffffffbd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbd0);
          std::__cxx11::string::operator=(local_140,local_1a0);
          std::__cxx11::string::~string(local_1a0);
          std::__cxx11::string::~string(local_1c0);
        }
        in_stack_fffffffffffffc15 =
             Directory::FileIsDirectory
                       ((Directory *)
                        CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                               CONCAT14(in_stack_fffffffffffffc14,
                                                                        in_stack_fffffffffffffc10)))
                                ),(size_t)in_stack_fffffffffffffc08);
        local_1c1 = in_stack_fffffffffffffc15;
        in_stack_fffffffffffffc14 =
             Directory::FileIsSymlink
                       ((Directory *)
                        CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                               CONCAT14(in_stack_fffffffffffffc14,
                                                                        in_stack_fffffffffffffc10)))
                                ),(size_t)in_stack_fffffffffffffc08);
        local_1c2 = in_stack_fffffffffffffc14;
        if (((local_1c1 & 1) == 0) ||
           (((bool)in_stack_fffffffffffffc14 && ((*(byte *)(in_RDI + 0x30) & 1) == 0)))) {
          bVar1 = std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                  ::empty((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                           *)in_stack_fffffffffffffbe0._M_current);
          if (!bVar1) {
            std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::back
                      ((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                        *)in_stack_fffffffffffffbd0);
            in_stack_fffffffffffffbce =
                 RegularExpression::find
                           (in_stack_fffffffffffffbd0,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffbcf,
                                     CONCAT16(in_stack_fffffffffffffbce,
                                              CONCAT24(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8))));
            if ((bool)in_stack_fffffffffffffbce) {
              AddFile(this_00,files,
                      (string *)
                      CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                             CONCAT14(in_stack_fffffffffffffc14,
                                                                      in_stack_fffffffffffffc10)))))
              ;
            }
          }
        }
        else if ((bool)in_stack_fffffffffffffc14) {
          *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
          in_stack_fffffffffffffc08 = local_1e8;
          std::__cxx11::string::string(in_stack_fffffffffffffc08);
          SystemTools::GetRealPath(in_stack_fffffffffffffbf8._M_current,in_stack_fffffffffffffbf0);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            if (in_RCX != (RegularExpression *)0x0) {
              std::operator+((char *)files,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffc14,
                                                  in_stack_fffffffffffffc10)))));
              std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
              std::operator+(in_stack_fffffffffffffbd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbd0);
              std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
              Message::Message((Message *)in_stack_fffffffffffffbd0,
                               CONCAT13(in_stack_fffffffffffffbcf,
                                        CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc
                                                )),(string *)0x1c26a5);
              std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::push_back
                        ((vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_> *)
                         in_stack_fffffffffffffbd0,
                         (value_type *)
                         CONCAT17(in_stack_fffffffffffffbcf,
                                  CONCAT16(in_stack_fffffffffffffbce,
                                           CONCAT24(in_stack_fffffffffffffbcc,
                                                    in_stack_fffffffffffffbc8))));
              Message::~Message((Message *)0x1c26c8);
              std::__cxx11::string::~string(local_250);
              std::__cxx11::string::~string(local_270);
              std::__cxx11::string::~string(local_290);
              std::__cxx11::string::~string(local_2b0);
            }
            local_1 = 0;
            local_114 = 1;
          }
          else {
            in_stack_fffffffffffffbf0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (in_RDI + 0x38);
            local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffbcf,
                                            CONCAT16(in_stack_fffffffffffffbce,
                                                     CONCAT24(in_stack_fffffffffffffbcc,
                                                              in_stack_fffffffffffffbc8))));
            local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffbcf,
                                          CONCAT16(in_stack_fffffffffffffbce,
                                                   CONCAT24(in_stack_fffffffffffffbcc,
                                                            in_stack_fffffffffffffbc8))));
            __first._M_current._7_1_ = in_stack_fffffffffffffbef;
            __first._M_current._0_7_ = in_stack_fffffffffffffbe8;
            in_stack_fffffffffffffbf8 =
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (__first,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            local_2b8 = in_stack_fffffffffffffbf8._M_current;
            local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffbcf,
                                          CONCAT16(in_stack_fffffffffffffbce,
                                                   CONCAT24(in_stack_fffffffffffffbcc,
                                                            in_stack_fffffffffffffbc8))));
            bVar1 = __gnu_cxx::operator==
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffbd0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffbcf,
                                           CONCAT16(in_stack_fffffffffffffbce,
                                                    CONCAT24(in_stack_fffffffffffffbcc,
                                                             in_stack_fffffffffffffbc8))));
            if (bVar1) {
              if ((*(byte *)(in_RDI + 0x51) & 1) != 0) {
                AddFile(this_00,files,
                        (string *)
                        CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                               CONCAT14(in_stack_fffffffffffffc14,
                                                                        in_stack_fffffffffffffc10)))
                                ));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffbe0._M_current,in_stack_fffffffffffffbd8);
              in_stack_fffffffffffffbef =
                   RecurseDirectory(in_RSI,in_RDX,(string *)in_RCX,in_stack_ffffffffffffffd0);
              if (!(bool)in_stack_fffffffffffffbef) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x1c2911);
                local_1 = 0;
                local_114 = 1;
                goto LAB_001c2be4;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x1c2937);
            }
            else if (in_RCX != (RegularExpression *)0x0) {
              std::__cxx11::string::string(local_2f0);
              in_stack_fffffffffffffbd8 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (in_RDI + 0x38);
              local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffbcf,
                                              CONCAT16(in_stack_fffffffffffffbce,
                                                       CONCAT24(in_stack_fffffffffffffbcc,
                                                                in_stack_fffffffffffffbc8))));
              local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffbcf,
                                            CONCAT16(in_stack_fffffffffffffbce,
                                                     CONCAT24(in_stack_fffffffffffffbcc,
                                                              in_stack_fffffffffffffbc8))));
              __first_00._M_current._7_1_ = in_stack_fffffffffffffbef;
              __first_00._M_current._0_7_ = in_stack_fffffffffffffbe8;
              in_stack_fffffffffffffbe0 =
                   std::
                   find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                             (__first_00,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
              local_300 = in_stack_fffffffffffffbe0._M_current;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffbd0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffbcf,
                                     CONCAT16(in_stack_fffffffffffffbce,
                                              CONCAT24(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8))));
              while( true ) {
                local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffbcf,
                                              CONCAT16(in_stack_fffffffffffffbce,
                                                       CONCAT24(in_stack_fffffffffffffbcc,
                                                                in_stack_fffffffffffffbc8))));
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)in_stack_fffffffffffffbd0,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffbcf,
                                               CONCAT16(in_stack_fffffffffffffbce,
                                                        CONCAT24(in_stack_fffffffffffffbcc,
                                                                 in_stack_fffffffffffffbc8))));
                if (!bVar1) break;
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2f8);
                std::operator+(in_stack_fffffffffffffbf8._M_current,
                               (char *)in_stack_fffffffffffffbf0);
                std::__cxx11::string::operator+=(local_2f0,local_338);
                std::__cxx11::string::~string(local_338);
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_2f8);
              }
              std::operator+(in_stack_fffffffffffffbf8._M_current,(char *)in_stack_fffffffffffffbf0)
              ;
              std::operator+(in_stack_fffffffffffffbd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbd0);
              std::__cxx11::string::operator+=(local_2f0,local_358);
              std::__cxx11::string::~string(local_358);
              in_stack_fffffffffffffbd0 = in_RCX;
              std::__cxx11::string::~string(local_378);
              in_RCX = in_stack_fffffffffffffbd0;
              Message::Message((Message *)in_stack_fffffffffffffbd0,
                               CONCAT13(in_stack_fffffffffffffbcf,
                                        CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc
                                                )),(string *)0x1c2b2f);
              std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::push_back
                        ((vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_> *)
                         in_stack_fffffffffffffbd0,
                         (value_type *)
                         CONCAT17(in_stack_fffffffffffffbcf,
                                  CONCAT16(in_stack_fffffffffffffbce,
                                           CONCAT24(in_stack_fffffffffffffbcc,
                                                    in_stack_fffffffffffffbc8))));
              Message::~Message((Message *)0x1c2b52);
              std::__cxx11::string::~string(local_2f0);
            }
            local_114 = 0;
          }
LAB_001c2be4:
          std::__cxx11::string::~string(local_208);
          std::__cxx11::string::~string(local_1e8);
          if (local_114 != 0) goto LAB_001c2d37;
        }
        else {
          if ((*(byte *)(in_RDI + 0x51) & 1) != 0) {
            AddFile(this_00,files,
                    (string *)
                    CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffc15,
                                                           CONCAT14(in_stack_fffffffffffffc14,
                                                                    in_stack_fffffffffffffc10)))));
          }
          in_stack_fffffffffffffbcf =
               RecurseDirectory(in_RSI,in_RDX,(string *)in_RCX,in_stack_ffffffffffffffd0);
          if (!(bool)in_stack_fffffffffffffbcf) {
            local_1 = 0;
            local_114 = 1;
            goto LAB_001c2d37;
          }
        }
      }
      local_120 = (Glob *)((long)&local_120->Internals + 1);
    }
    local_1 = 1;
    local_114 = 1;
LAB_001c2d37:
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_140);
  }
  else {
    if ((in_RCX != (RegularExpression *)0x0) &&
       (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      std::operator+(in_stack_fffffffffffffc18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,
                                                CONCAT14(in_stack_fffffffffffffc14,
                                                         in_stack_fffffffffffffc10)))));
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      std::operator+(in_stack_fffffffffffffbd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbd0);
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      Message::Message((Message *)in_stack_fffffffffffffbd0,
                       CONCAT13(in_stack_fffffffffffffbcf,
                                CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc)),
                       (string *)0x1c220b);
      std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::push_back
                ((vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_> *)
                 in_stack_fffffffffffffbd0,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      Message::~Message((Message *)0x1c222e);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
    }
    local_1 = 1;
    local_114 = 1;
  }
  std::__cxx11::string::~string(local_50);
  Directory::~Directory((Directory *)in_stack_fffffffffffffbd0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  std::string errorMessage;
  if (!d.Load(dir, &errorMessage)) {
    if (messages) {
      if (!errorMessage.empty()) {
        messages->push_back(Message(Glob::warning,
                                    "Error listing directory '" + dir +
                                      "'! Reason: '" + errorMessage + "'"));
      }
    }
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = d.FileIsDirectory(cc);
    bool isSymLink = d.FileIsSymlink(cc);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}